

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::Matcher
          (Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *this,
          BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> value)

{
  ExprBase this_00;
  ExprBase in_RDI;
  EqMatcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *in_stack_ffffffffffffffd8;
  
  internal::MatcherBase<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::MatcherBase
            ((MatcherBase<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)0x15885c);
  *(undefined ***)in_RDI.impl_ = &PTR__Matcher_002a1a78;
  this_00.impl_ =
       (Impl *)Eq<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                         ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)in_RDI.impl_);
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffffd8);
  operator=((Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)this_00.impl_,
            (Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)in_RDI.impl_);
  ~Matcher((Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)0x1588ba);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }